

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O3

ChStreamOutAscii * chrono::operator<<(ChStreamOutAscii *mstream,myEmployeeCustomConstructor **obj)

{
  size_t sVar1;
  ChStreamOutAscii *pCVar2;
  string mystring;
  vector<char,_std::allocator<char>_> mvect;
  ChStreamOutAsciiVector mtempstream;
  ChNameValue<myEmployeeCustomConstructor_*> local_1a8;
  vector<char,_std::allocator<char>_> local_188;
  undefined1 local_168 [24];
  ChStreamOutAscii local_150 [8];
  char local_148 [24];
  ChArchiveOut local_130;
  ChStreamOutAscii *local_28;
  undefined1 local_20;
  
  local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ChStreamOutAsciiVector::ChStreamOutAsciiVector((ChStreamOutAsciiVector *)local_168,&local_188);
  sVar1 = strlen((char *)(mstream + 8));
  if (sVar1 < 10) {
    strcpy(local_148,(char *)(mstream + 8));
  }
  ChArchiveOut::ChArchiveOut(&local_130);
  local_130.super_ChArchive._vptr_ChArchive = (_func_int **)&PTR__ChArchiveOut_00159078;
  local_130._260_4_ = 0;
  local_1a8._name = "";
  local_130.cut_all_pointers = true;
  local_20 = 1;
  local_130.super_ChArchive.use_versions = false;
  local_1a8._flags = '\0';
  local_1a8._value = obj;
  local_28 = local_150;
  ChArchiveOut::out<myEmployeeCustomConstructor>(&local_130,&local_1a8);
  local_1a8._name = &local_1a8._flags;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)&local_1a8,*(undefined8 *)local_168._8_8_,
             *(undefined8 *)(local_168._8_8_ + 8));
  pCVar2 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(mstream,(string *)&local_1a8);
  if (local_1a8._name != &local_1a8._flags) {
    operator_delete(local_1a8._name,CONCAT71(local_1a8._17_7_,local_1a8._flags) + 1);
  }
  ChArchiveOut::~ChArchiveOut(&local_130);
  chrono::ChStreamOutAscii::~ChStreamOutAscii(local_150);
  chrono::ChStreamVectorWrapper::~ChStreamVectorWrapper((ChStreamVectorWrapper *)local_168);
  if (local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pCVar2;
}

Assistant:

ChStreamOutAscii & operator<<(ChStreamOutAscii &mstream, const T& obj) {
    std::vector<char> mvect;
    ChStreamOutAsciiVector mtempstream(&mvect);
    mtempstream.SetNumFormat(mstream.GetNumFormat());
    ChArchiveAsciiDump marchive(mtempstream);
    // this avoids printing too much except the object:
    marchive.SetCutAllPointers(true);
    marchive.SetSuppressNames(true);
    marchive.SetUseVersions(false);
    marchive << CHNVP(obj,"");
    std::string mystring(mtempstream.GetVector()->begin(),mtempstream.GetVector()->end());
    return mstream << mystring;
}